

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * ghc::filesystem::read_symlink(path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  error_category *peVar3;
  uintmax_t *in_RCX;
  time_t *in_R8;
  path result;
  file_status fs;
  path local_50;
  int local_30;
  
  detail::symlink_status_ex((path *)&local_30,(error_code *)p,(uintmax_t *)ec,in_RCX,in_R8);
  paVar1 = &(__return_storage_ptr__->_path).field_2;
  if (local_30 == 4) {
    detail::resolveSymlink(&local_50,p,ec);
    iVar2 = ec->_M_value;
    (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
    if (iVar2 == 0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_50._path._M_dataplus._M_p,
                 local_50._path._M_dataplus._M_p + local_50._path._M_string_length);
    }
    else {
      (__return_storage_ptr__->_path)._M_string_length = 0;
      (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._path._M_dataplus._M_p != &local_50._path.field_2) {
      operator_delete(local_50._path._M_dataplus._M_p,
                      local_50._path.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    peVar3 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0x16;
    ec->_M_cat = peVar3;
    (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path read_symlink(const path& p, std::error_code& ec)
{
    file_status fs = symlink_status(p, ec);
    if (fs.type() != file_type::symlink) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
        return path();
    }
    auto result = detail::resolveSymlink(p, ec);
    return ec ? path() : result;
}